

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Huffman.cpp
# Opt level: O2

void __thiscall
HuffmanNode::HuffmanNode
          (HuffmanNode *this,shared_ptr<HuffmanNode> *left,shared_ptr<HuffmanNode> *right)

{
  this->c_ = '0';
  (this->left_).super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->left_).super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->right_).super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->right_).super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->n_ = ((right->super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->n_ +
             ((left->super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->n_;
  std::__shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->left_).super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>,
             &left->super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->right_).super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>,
             &right->super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

HuffmanNode::HuffmanNode(const shared_ptr<HuffmanNode>& left,
                         const shared_ptr<HuffmanNode>& right) : c_('0') {
  this->n_ = left->get_n() + right->get_n();
  this->left_ = left;
  this->right_ = right;
}